

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O3

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::disp_data_source_t::distribute_value_for_work_thread
          (disp_data_source_t *this,mbox_t *mbox,priority_t priority,size_t agents_count,
          work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
          *wt)

{
  long lVar1;
  char cVar2;
  size_t sVar3;
  undefined1 *puVar4;
  long lVar5;
  prefix_t prefix;
  ostringstream ss;
  suffix_t local_218;
  size_t local_210;
  id local_208;
  work_thread_activity_stats_t local_200;
  prefix_t local_1d0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_210 = agents_count;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  sVar3 = strlen((this->m_base_prefix).m_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(this->m_base_prefix).m_value,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"/wt-p",5);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__cxx11::stringbuf::str();
  cVar2 = *(char *)local_200.m_working_stats.m_count;
  if (cVar2 == '\0') {
    puVar4 = local_1d0.m_value;
  }
  else {
    lVar1 = 0;
    do {
      lVar5 = lVar1;
      *(char *)((long)&local_1d0 + lVar5) = cVar2;
      cVar2 = *(char *)(local_200.m_working_stats.m_count + lVar5 + 1);
      if (cVar2 == '\0') break;
      lVar1 = lVar5 + 1;
    } while (lVar5 != 0x2e);
    puVar4 = (undefined1 *)((long)&local_1d0 + lVar5 + 1);
  }
  *puVar4 = 0;
  if ((duration_t *)local_200.m_working_stats.m_count != &local_200.m_working_stats.m_avg_time) {
    operator_delete((void *)local_200.m_working_stats.m_count);
  }
  local_200.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::work_thread_queue_size();
  local_218.m_value =
       (char *)reuse::work_thread::demand_queue_details::
               queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>
               ::demands_count(&(wt->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_queue,
                               &(wt->super_activity_tracking_impl_t).
                                super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
                                .m_demands_count);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long>
            (mbox,&local_1d0,(suffix_t *)&local_200,(unsigned_long *)&local_218);
  local_200.m_working_stats.m_count = (uint_fast64_t)stats::suffixes::agent_count();
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::quantity<unsigned_long>,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,unsigned_long&>
            (mbox,&local_1d0,(suffix_t *)&local_200,&local_210);
  local_218 = stats::suffixes::work_thread_activity();
  local_208._M_thread =
       (wt->super_activity_tracking_impl_t).
       super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
       .m_thread_id._M_thread;
  reuse::work_thread::details::activity_tracking_impl_t::take_activity_stats
            (&local_200,&wt->super_activity_tracking_impl_t);
  so_5::impl::instantiator_and_sender_base<so_5::stats::messages::work_thread_activity,false>::
  send<so_5::stats::prefix_t_const&,so_5::stats::suffix_t,std::thread::id,so_5::stats::work_thread_activity_stats_t>
            (mbox,&local_1d0,&local_218,&local_208,&local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void
				distribute_value_for_work_thread(
					const mbox_t & mbox,
					priority_t priority,
					std::size_t agents_count,
					WORK_THREAD & wt )
					{
						std::ostringstream ss;
						ss << m_base_prefix.c_str() << "/wt-p" << to_size_t(priority);

						const stats::prefix_t prefix{ ss.str() };

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::work_thread_queue_size(),
								wt.demands_count() );

						so_5::send< stats::messages::quantity< std::size_t > >(
								mbox,
								prefix,
								stats::suffixes::agent_count(),
								agents_count );

						send_thread_activity_stats( mbox, prefix, wt );
					}